

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ccolumn_bmod.c
# Opt level: O1

int ccolumn_bmod(int jcol,int nseg,singlecomplex *dense,singlecomplex *tempv,int *segrep,int *repfnz
                ,int fpanelc,GlobalLU_t *Glu,SuperLUStat_t *stat)

{
  uint ncol;
  long lVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  int iVar10;
  int_t *piVar11;
  uint uVar12;
  int_t iVar13;
  long lVar14;
  ulong uVar15;
  long lVar16;
  singlecomplex *psVar17;
  int iVar18;
  float *pfVar19;
  ulong uVar20;
  int iVar21;
  int iVar22;
  int iVar23;
  int_t next;
  int iVar24;
  int iVar25;
  int iVar26;
  long lVar27;
  int iVar28;
  long lVar29;
  long lVar30;
  int iVar31;
  int ldm;
  float fVar32;
  float fVar33;
  float fVar34;
  float fVar35;
  float fVar36;
  void *local_d0;
  int_t local_c4;
  int_t *local_c0;
  int local_b8;
  uint local_b4;
  singlecomplex *local_b0;
  int_t *local_a8;
  int_t *local_a0;
  ulong local_98;
  singlecomplex *local_90;
  uint local_84;
  long local_80;
  long local_78;
  int *local_70;
  long local_68;
  flops_t *local_60;
  long local_58;
  long local_50;
  int *local_48;
  int *local_40;
  int *local_38;
  
  local_60 = stat->ops;
  local_70 = Glu->xsup;
  local_40 = Glu->supno;
  local_c0 = Glu->lsub;
  local_a8 = Glu->xlsub;
  local_d0 = Glu->lusup;
  local_a0 = Glu->xlusup;
  local_c4 = Glu->nzlumax;
  local_78 = (long)jcol;
  local_68 = (long)local_40[local_78];
  local_b8 = jcol;
  local_b4 = nseg;
  local_b0 = tempv;
  local_48 = repfnz;
  local_38 = segrep;
  if (0 < nseg) {
    uVar15 = (ulong)(uint)nseg;
    local_80 = (long)local_d0 + 0xc;
    local_58 = (long)local_d0 + 4;
    uVar20 = 0;
    do {
      piVar11 = local_c0;
      iVar23 = local_38[uVar15 - 1];
      local_98 = uVar20;
      local_90 = (singlecomplex *)uVar15;
      if ((int)local_68 != local_40[iVar23]) {
        iVar21 = local_70[local_40[iVar23]];
        iVar25 = fpanelc;
        if (fpanelc < iVar21) {
          iVar25 = iVar21;
        }
        iVar26 = iVar25 - iVar21;
        iVar18 = local_a0[iVar25] + iVar26;
        iVar22 = local_a8[iVar21] + iVar26;
        iVar24 = local_48[iVar23];
        if (local_48[iVar23] <= fpanelc) {
          iVar24 = fpanelc;
        }
        uVar12 = iVar23 - iVar25;
        iVar10 = local_a8[(long)iVar21 + 1];
        lVar14 = (long)iVar10;
        ldm = iVar10 - local_a8[iVar21];
        iVar28 = iVar22 + uVar12;
        iVar21 = uVar12 + 1 + iVar22;
        iVar31 = iVar23 - iVar24;
        if (iVar31 == 0) {
          if (iVar21 < iVar10) {
            fVar35 = dense[local_c0[iVar28]].r;
            fVar36 = dense[local_c0[iVar28]].i;
            lVar16 = (long)iVar21;
            pfVar19 = (float *)(local_58 + (long)(int)(ldm * uVar12 + iVar18 + uVar12 + 1) * 8);
            do {
              iVar23 = local_c0[lVar16];
              fVar34 = pfVar19[-1];
              fVar2 = *pfVar19;
              fVar32 = dense[iVar23].i;
              dense[iVar23].r = dense[iVar23].r - (fVar35 * fVar34 + fVar2 * -fVar36);
              dense[iVar23].i = fVar32 - (fVar34 * fVar36 + fVar2 * fVar35);
              lVar16 = lVar16 + 1;
              pfVar19 = pfVar19 + 2;
            } while (lVar16 < lVar14);
          }
        }
        else {
          ncol = iVar31 + 1;
          if (iVar31 < 3) {
            iVar23 = local_c0[iVar28];
            iVar18 = (ldm + 1) * uVar12 + iVar18;
            iVar25 = local_c0[(long)iVar28 + -1];
            fVar35 = dense[iVar25].r;
            fVar36 = dense[iVar25].i;
            lVar16 = (long)(iVar18 - ldm);
            if (ncol == 2) {
              fVar34 = *(float *)((long)local_d0 + lVar16 * 8);
              fVar2 = *(float *)((long)local_d0 + lVar16 * 8 + 4);
              fVar32 = dense[iVar23].r - (fVar35 * fVar34 - fVar2 * fVar36);
              fVar34 = dense[iVar23].i - (fVar34 * fVar36 + fVar2 * fVar35);
              dense[iVar23].r = fVar32;
              dense[iVar23].i = fVar34;
              if (iVar21 < iVar10) {
                lVar16 = local_80 + lVar16 * 8;
                lVar29 = local_80 + (long)iVar18 * 8;
                lVar27 = 0;
                do {
                  iVar23 = local_c0[iVar21 + lVar27];
                  fVar2 = *(float *)(lVar29 + -4 + lVar27 * 8);
                  fVar3 = *(float *)(lVar29 + lVar27 * 8);
                  fVar4 = *(float *)(lVar16 + -4 + lVar27 * 8);
                  fVar5 = *(float *)(lVar16 + lVar27 * 8);
                  fVar33 = dense[iVar23].i;
                  dense[iVar23].r =
                       dense[iVar23].r -
                       (fVar35 * fVar4 + fVar5 * -fVar36 + fVar32 * fVar2 + fVar3 * -fVar34);
                  dense[iVar23].i =
                       fVar33 - (fVar4 * fVar36 + fVar5 * fVar35 + fVar2 * fVar34 + fVar3 * fVar32);
                  lVar30 = iVar21 + lVar27;
                  lVar27 = lVar27 + 1;
                } while (lVar30 + 1 < lVar14);
              }
            }
            else {
              fVar34 = dense[local_c0[(long)iVar28 + -2]].r;
              fVar2 = dense[local_c0[(long)iVar28 + -2]].i;
              lVar29 = (long)((iVar18 - ldm) - ldm);
              fVar32 = *(float *)((long)local_d0 + lVar29 * 8 + -8);
              fVar3 = *(float *)((long)local_d0 + lVar29 * 8 + -4);
              fVar35 = fVar35 - (fVar34 * fVar32 - fVar3 * fVar2);
              fVar36 = fVar36 - (fVar32 * fVar2 + fVar3 * fVar34);
              fVar32 = *(float *)((long)local_d0 + lVar16 * 8);
              fVar3 = *(float *)((long)local_d0 + lVar16 * 8 + 4);
              fVar4 = *(float *)((long)local_d0 + lVar29 * 8);
              fVar5 = *(float *)((long)local_d0 + lVar29 * 8 + 4);
              fVar33 = dense[iVar23].r -
                       ((fVar34 * fVar4 - fVar5 * fVar2) + (fVar35 * fVar32 - fVar3 * fVar36));
              fVar32 = dense[iVar23].i -
                       (fVar4 * fVar2 + fVar5 * fVar34 + fVar32 * fVar36 + fVar3 * fVar35);
              dense[iVar23].r = fVar33;
              dense[iVar23].i = fVar32;
              dense[iVar25].r = fVar35;
              dense[iVar25].i = fVar36;
              if (iVar21 < iVar10) {
                lVar27 = lVar16 * 8 + (long)ldm * -8 + local_80;
                lVar16 = local_80 + lVar16 * 8;
                lVar29 = local_80 + (long)iVar18 * 8;
                lVar30 = 0;
                do {
                  iVar23 = local_c0[iVar21 + lVar30];
                  fVar3 = *(float *)(lVar29 + -4 + lVar30 * 8);
                  fVar4 = *(float *)(lVar29 + lVar30 * 8);
                  fVar5 = *(float *)(lVar16 + -4 + lVar30 * 8);
                  fVar6 = *(float *)(lVar16 + lVar30 * 8);
                  fVar7 = *(float *)(lVar27 + -4 + lVar30 * 8);
                  fVar8 = *(float *)(lVar27 + lVar30 * 8);
                  fVar9 = dense[iVar23].i;
                  dense[iVar23].r =
                       dense[iVar23].r -
                       (fVar34 * fVar7 + fVar8 * -fVar2 +
                       fVar35 * fVar5 + fVar6 * -fVar36 + fVar33 * fVar3 + fVar4 * -fVar32);
                  dense[iVar23].i =
                       fVar9 - (fVar7 * fVar2 + fVar8 * fVar34 +
                               fVar5 * fVar36 + fVar6 * fVar35 + fVar3 * fVar32 + fVar4 * fVar33);
                  lVar1 = iVar21 + lVar30;
                  lVar30 = lVar30 + 1;
                } while (lVar1 + 1 < lVar14);
              }
            }
          }
          else {
            uVar12 = (~uVar12 - iVar26) + ldm;
            iVar22 = iVar22 + (iVar24 - iVar25);
            uVar15 = (ulong)((iVar23 - iVar24) + 1);
            uVar20 = 0;
            do {
              tempv[uVar20] = dense[local_c0[(long)iVar22 + uVar20]];
              uVar20 = uVar20 + 1;
            } while (uVar15 != uVar20);
            local_50 = (long)((ldm + 1) * (iVar24 - iVar25) + iVar18);
            local_84 = ncol;
            clsolve(ldm,ncol,(singlecomplex *)((long)local_d0 + local_50 * 8),tempv);
            psVar17 = local_b0 + local_84;
            cmatvec(ldm,uVar12,local_84,
                    (singlecomplex *)((long)local_d0 + (long)(int)((int)local_50 + local_84) * 8),
                    local_b0,psVar17);
            uVar20 = 0;
            iVar23 = iVar22;
            do {
              dense[piVar11[(long)iVar22 + uVar20]] = local_b0[uVar20];
              local_b0[uVar20].r = 0.0;
              local_b0[uVar20].i = 0.0;
              uVar20 = uVar20 + 1;
              iVar23 = iVar23 + 1;
            } while (uVar15 != uVar20);
            tempv = local_b0;
            if (0 < (int)uVar12) {
              uVar20 = 0;
              do {
                iVar21 = local_c0[(long)iVar23 + uVar20];
                fVar35 = dense[iVar21].i;
                dense[iVar21].r = dense[iVar21].r - psVar17[uVar20].r;
                dense[iVar21].i = fVar35 - psVar17[uVar20].i;
                psVar17[uVar20].r = 0.0;
                psVar17[uVar20].i = 0.0;
                uVar20 = uVar20 + 1;
              } while (uVar20 < uVar12);
            }
          }
        }
      }
      uVar15 = (long)local_90 - 1;
      uVar12 = (int)local_98 + 1;
      uVar20 = (ulong)uVar12;
    } while (uVar12 != local_b4);
  }
  next = local_a0[local_78];
  iVar23 = local_70[local_68];
  iVar21 = (local_a8[(long)iVar23 + 1] + next) - local_a8[iVar23];
  if (local_c4 < iVar21) {
    do {
      iVar13 = cLUMemXpand(local_b8,next,LUSUP,&local_c4,Glu);
      if (iVar13 != 0) {
        return iVar13;
      }
    } while (local_c4 < iVar21);
    local_c0 = Glu->lsub;
    local_d0 = Glu->lusup;
  }
  lVar14 = (long)local_a8[iVar23];
  if (local_a8[iVar23] < local_a8[(long)iVar23 + 1]) {
    psVar17 = (singlecomplex *)((long)next * 8 + (long)local_d0);
    do {
      iVar21 = local_c0[lVar14];
      *psVar17 = dense[iVar21];
      dense[iVar21].r = 0.0;
      dense[iVar21].i = 0.0;
      lVar14 = lVar14 + 1;
      psVar17 = psVar17 + 1;
      next = next + 1;
    } while (lVar14 < local_a8[(long)iVar23 + 1]);
  }
  if (fpanelc < iVar23) {
    fpanelc = iVar23;
  }
  local_a0[local_78 + 1] = next;
  iVar21 = local_b8 - fpanelc;
  if (iVar21 != 0 && fpanelc <= local_b8) {
    iVar25 = local_a0[fpanelc];
    iVar24 = local_a8[(long)iVar23 + 1] - local_a8[iVar23];
    uVar12 = (iVar23 - local_b8) + iVar24;
    iVar22 = local_a0[local_78];
    local_60[0x13] = (float)((iVar21 + -1) * iVar21 * 4) + local_60[0x13];
    local_98 = (long)iVar25 + (long)(fpanelc - iVar23);
    lVar14 = (long)iVar22 + (long)(fpanelc - iVar23);
    local_60[0x14] = (float)(int)(iVar21 * uVar12 * 8) + local_60[0x14];
    local_90 = (singlecomplex *)((long)local_d0 + lVar14 * 8);
    clsolve(iVar24,iVar21,(singlecomplex *)(local_98 * 8 + (long)local_d0),local_90);
    psVar17 = local_b0;
    cmatvec(iVar24,uVar12,iVar21,
            (singlecomplex *)((long)local_d0 + (long)((int)local_98 + iVar21) * 8),local_90,local_b0
           );
    if (0 < (int)uVar12) {
      iVar21 = (int)lVar14 + iVar21;
      lVar14 = (long)iVar21 * 8 + 4;
      uVar20 = 0;
      do {
        fVar35 = *(float *)((long)local_d0 + uVar20 * 8 + lVar14);
        *(float *)((long)local_d0 + uVar20 * 8 + (long)iVar21 * 8) =
             *(float *)((long)local_d0 + uVar20 * 8 + (long)iVar21 * 8) - psVar17[uVar20].r;
        *(float *)((long)local_d0 + uVar20 * 8 + lVar14) = fVar35 - psVar17[uVar20].i;
        psVar17[uVar20].r = 0.0;
        psVar17[uVar20].i = 0.0;
        uVar20 = uVar20 + 1;
      } while (uVar20 < uVar12);
    }
  }
  return 0;
}

Assistant:

int
ccolumn_bmod (
	     const int  jcol,	  /* in */
	     const int  nseg,	  /* in */
	     singlecomplex     *dense,	  /* in */
	     singlecomplex     *tempv,	  /* working array */
	     int        *segrep,  /* in */
	     int        *repfnz,  /* in */
	     int        fpanelc,  /* in -- first column in the current panel */
	     GlobalLU_t *Glu,     /* modified */
	     SuperLUStat_t *stat  /* output */
	     )
{

#ifdef _CRAY
    _fcd ftcs1 = _cptofcd("L", strlen("L")),
         ftcs2 = _cptofcd("N", strlen("N")),
         ftcs3 = _cptofcd("U", strlen("U"));
#endif
    int         incx = 1, incy = 1;
    singlecomplex      alpha, beta;
    
    /* krep = representative of current k-th supernode
     * fsupc = first supernodal column
     * nsupc = no of columns in supernode
     * nsupr = no of rows in supernode (used as leading dimension)
     * luptr = location of supernodal LU-block in storage
     * kfnz = first nonz in the k-th supernodal segment
     * no_zeros = no of leading zeros in a supernodal U-segment
     */
    singlecomplex      ukj, ukj1, ukj2;
    int_t        luptr, luptr1, luptr2;
    int          fsupc, nsupc, nsupr, segsze;
    int          nrow;	  /* No of rows in the matrix of matrix-vector */
    int          jcolp1, jsupno, k, ksub, krep, krep_ind, ksupno;
    int_t        lptr, kfnz, isub, irow, i;
    int_t        no_zeros, new_next, ufirst, nextlu;
    int          fst_col; /* First column within small LU update */
    int          d_fsupc; /* Distance between the first column of the current
			     panel and the first column of the current snode. */
    int          *xsup, *supno;
    int_t        *lsub, *xlsub;
    singlecomplex       *lusup;
    int_t        *xlusup;
    int_t        nzlumax;
    singlecomplex       *tempv1;
    singlecomplex      zero = {0.0, 0.0};
    singlecomplex      one = {1.0, 0.0};
    singlecomplex      none = {-1.0, 0.0};
    singlecomplex	 comp_temp, comp_temp1;
    int_t        mem_error;
    flops_t      *ops = stat->ops;

    xsup    = Glu->xsup;
    supno   = Glu->supno;
    lsub    = Glu->lsub;
    xlsub   = Glu->xlsub;
    lusup   = (singlecomplex *) Glu->lusup;
    xlusup  = Glu->xlusup;
    nzlumax = Glu->nzlumax;
    jcolp1 = jcol + 1;
    jsupno = supno[jcol];
    
    /* 
     * For each nonz supernode segment of U[*,j] in topological order 
     */
    k = nseg - 1;
    for (ksub = 0; ksub < nseg; ksub++) {

	krep = segrep[k];
	k--;
	ksupno = supno[krep];
	if ( jsupno != ksupno ) { /* Outside the rectangular supernode */

	    fsupc = xsup[ksupno];
	    fst_col = SUPERLU_MAX ( fsupc, fpanelc );

  	    /* Distance from the current supernode to the current panel; 
	       d_fsupc=0 if fsupc > fpanelc. */
  	    d_fsupc = fst_col - fsupc; 

	    luptr = xlusup[fst_col] + d_fsupc;
	    lptr = xlsub[fsupc] + d_fsupc;

	    kfnz = repfnz[krep];
	    kfnz = SUPERLU_MAX ( kfnz, fpanelc );

	    segsze = krep - kfnz + 1;
	    nsupc = krep - fst_col + 1;
	    nsupr = xlsub[fsupc+1] - xlsub[fsupc];	/* Leading dimension */
	    nrow = nsupr - d_fsupc - nsupc;
	    krep_ind = lptr + nsupc - 1;




	    /* 
	     * Case 1: Update U-segment of size 1 -- col-col update 
	     */
	    if ( segsze == 1 ) {
	  	ukj = dense[lsub[krep_ind]];
		luptr += nsupr*(nsupc-1) + nsupc;

		for (i = lptr + nsupc; i < xlsub[fsupc+1]; ++i) {
		    irow = lsub[i];
		    cc_mult(&comp_temp, &ukj, &lusup[luptr]);
		    c_sub(&dense[irow], &dense[irow], &comp_temp);
		    luptr++;
		}

	    } else if ( segsze <= 3 ) {
		ukj = dense[lsub[krep_ind]];
		luptr += nsupr*(nsupc-1) + nsupc-1;
		ukj1 = dense[lsub[krep_ind - 1]];
		luptr1 = luptr - nsupr;

		if ( segsze == 2 ) { /* Case 2: 2cols-col update */
		    cc_mult(&comp_temp, &ukj1, &lusup[luptr1]);
		    c_sub(&ukj, &ukj, &comp_temp);
		    dense[lsub[krep_ind]] = ukj;
		    for (i = lptr + nsupc; i < xlsub[fsupc+1]; ++i) {
		    	irow = lsub[i];
		    	luptr++;
		    	luptr1++;
			cc_mult(&comp_temp, &ukj, &lusup[luptr]);
			cc_mult(&comp_temp1, &ukj1, &lusup[luptr1]);
			c_add(&comp_temp, &comp_temp, &comp_temp1);
			c_sub(&dense[irow], &dense[irow], &comp_temp);
		    }
		} else { /* Case 3: 3cols-col update */
		    ukj2 = dense[lsub[krep_ind - 2]];
		    luptr2 = luptr1 - nsupr;
  		    cc_mult(&comp_temp, &ukj2, &lusup[luptr2-1]);
		    c_sub(&ukj1, &ukj1, &comp_temp);

		    cc_mult(&comp_temp, &ukj1, &lusup[luptr1]);
		    cc_mult(&comp_temp1, &ukj2, &lusup[luptr2]);
		    c_add(&comp_temp, &comp_temp, &comp_temp1);
		    c_sub(&ukj, &ukj, &comp_temp);

		    dense[lsub[krep_ind]] = ukj;
		    dense[lsub[krep_ind-1]] = ukj1;
		    for (i = lptr + nsupc; i < xlsub[fsupc+1]; ++i) {
		    	irow = lsub[i];
		    	luptr++;
		    	luptr1++;
			luptr2++;
			cc_mult(&comp_temp, &ukj, &lusup[luptr]);
			cc_mult(&comp_temp1, &ukj1, &lusup[luptr1]);
			c_add(&comp_temp, &comp_temp, &comp_temp1);
			cc_mult(&comp_temp1, &ukj2, &lusup[luptr2]);
			c_add(&comp_temp, &comp_temp, &comp_temp1);
			c_sub(&dense[irow], &dense[irow], &comp_temp);
		    }
		}


	    } else {
	  	/*
		 * Case: sup-col update
		 * Perform a triangular solve and block update,
		 * then scatter the result of sup-col update to dense
		 */

		no_zeros = kfnz - fst_col;

	        /* Copy U[*,j] segment from dense[*] to tempv[*] */
	        isub = lptr + no_zeros;
	        for (i = 0; i < segsze; i++) {
	  	    irow = lsub[isub];
		    tempv[i] = dense[irow];
		    ++isub; 
	        }

	        /* Dense triangular solve -- start effective triangle */
		luptr += nsupr * no_zeros + no_zeros; 
		
#ifdef USE_VENDOR_BLAS
#ifdef _CRAY
		CTRSV( ftcs1, ftcs2, ftcs3, &segsze, &lusup[luptr], 
		       &nsupr, tempv, &incx );
#else		
		ctrsv_( "L", "N", "U", &segsze, &lusup[luptr], 
		       &nsupr, tempv, &incx );
#endif		
 		luptr += segsze;  /* Dense matrix-vector */
		tempv1 = &tempv[segsze];
                alpha = one;
                beta = zero;
#ifdef _CRAY
		CGEMV( ftcs2, &nrow, &segsze, &alpha, &lusup[luptr], 
		       &nsupr, tempv, &incx, &beta, tempv1, &incy );
#else
		cgemv_( "N", &nrow, &segsze, &alpha, &lusup[luptr], 
		       &nsupr, tempv, &incx, &beta, tempv1, &incy );
#endif
#else
		clsolve ( nsupr, segsze, &lusup[luptr], tempv );

 		luptr += segsze;  /* Dense matrix-vector */
		tempv1 = &tempv[segsze];
		cmatvec (nsupr, nrow , segsze, &lusup[luptr], tempv, tempv1);
#endif
		
		
                /* Scatter tempv[] into SPA dense[] as a temporary storage */
                isub = lptr + no_zeros;
                for (i = 0; i < segsze; i++) {
                    irow = lsub[isub];
                    dense[irow] = tempv[i];
                    tempv[i] = zero;
                    ++isub;
                }

		/* Scatter tempv1[] into SPA dense[] */
		for (i = 0; i < nrow; i++) {
		    irow = lsub[isub];
		    c_sub(&dense[irow], &dense[irow], &tempv1[i]);
		    tempv1[i] = zero;
		    ++isub;
		}
	    }
	    
	} /* if jsupno ... */

    } /* for each segment... */

    /*
     *	Process the supernodal portion of L\U[*,j]
     */
    nextlu = xlusup[jcol];
    fsupc = xsup[jsupno];

    /* Copy the SPA dense into L\U[*,j] */
    new_next = nextlu + xlsub[fsupc+1] - xlsub[fsupc];
    while ( new_next > nzlumax ) {
	mem_error = cLUMemXpand(jcol, nextlu, LUSUP, &nzlumax, Glu);
	if (mem_error) return (mem_error);
	lusup = (singlecomplex *) Glu->lusup;
	lsub = Glu->lsub;
    }

    for (isub = xlsub[fsupc]; isub < xlsub[fsupc+1]; isub++) {
  	irow = lsub[isub];
	lusup[nextlu] = dense[irow];
        dense[irow] = zero;
	++nextlu;
    }

    xlusup[jcolp1] = nextlu;	/* Close L\U[*,jcol] */

    /* For more updates within the panel (also within the current supernode), 
     * should start from the first column of the panel, or the first column 
     * of the supernode, whichever is bigger. There are 2 cases:
     *    1) fsupc < fpanelc, then fst_col := fpanelc
     *    2) fsupc >= fpanelc, then fst_col := fsupc
     */
    fst_col = SUPERLU_MAX ( fsupc, fpanelc );

    if ( fst_col < jcol ) {

  	/* Distance between the current supernode and the current panel.
	   d_fsupc=0 if fsupc >= fpanelc. */
  	d_fsupc = fst_col - fsupc;

	lptr = xlsub[fsupc] + d_fsupc;
	luptr = xlusup[fst_col] + d_fsupc;
	nsupr = xlsub[fsupc+1] - xlsub[fsupc];	/* Leading dimension */
	nsupc = jcol - fst_col;	/* Excluding jcol */
	nrow = nsupr - d_fsupc - nsupc;

	/* Points to the beginning of jcol in snode L\U(jsupno) */
	ufirst = xlusup[jcol] + d_fsupc;	

	ops[TRSV] += 4 * nsupc * (nsupc - 1);
	ops[GEMV] += 8 * nrow * nsupc;
	
#ifdef USE_VENDOR_BLAS
#ifdef _CRAY
	CTRSV( ftcs1, ftcs2, ftcs3, &nsupc, &lusup[luptr], 
	       &nsupr, &lusup[ufirst], &incx );
#else
	ctrsv_( "L", "N", "U", &nsupc, &lusup[luptr], 
	       &nsupr, &lusup[ufirst], &incx );
#endif
	
	alpha = none; beta = one; /* y := beta*y + alpha*A*x */

#ifdef _CRAY
	CGEMV( ftcs2, &nrow, &nsupc, &alpha, &lusup[luptr+nsupc], &nsupr,
	       &lusup[ufirst], &incx, &beta, &lusup[ufirst+nsupc], &incy );
#else
	cgemv_( "N", &nrow, &nsupc, &alpha, &lusup[luptr+nsupc], &nsupr,
	       &lusup[ufirst], &incx, &beta, &lusup[ufirst+nsupc], &incy );
#endif
#else
	clsolve ( nsupr, nsupc, &lusup[luptr], &lusup[ufirst] );

	cmatvec ( nsupr, nrow, nsupc, &lusup[luptr+nsupc],
		&lusup[ufirst], tempv );
	
        /* Copy updates from tempv[*] into lusup[*] */
	isub = ufirst + nsupc;
	for (i = 0; i < nrow; i++) {
	    c_sub(&lusup[isub], &lusup[isub], &tempv[i]);
	    tempv[i] = zero;
	    ++isub;
	}

#endif
	
	
    } /* if fst_col < jcol ... */ 

    return 0;
}